

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetter_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 index;
  undefined4 *puVar4;
  Var pvVar5;
  DescriptorFlags DVar6;
  int local_54;
  DictionaryPropertyDescriptor<int> *pDStack_50;
  int i;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  ScriptContext *local_38;
  
  propertyRecord = (PropertyRecord *)info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_38 = requestContext;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x284,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    requestContext = local_38;
  }
  descriptor = (DictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar2) {
    DVar6 = None;
    if ((pDStack_50->Attributes & 8) == 0) {
      iVar3 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_50);
      if (iVar3 == -1) {
        iVar3 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDStack_50);
        if (iVar3 != -1) {
          iVar3 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDStack_50);
          pvVar5 = DynamicObject::GetSlot(instance,iVar3);
          *setterValue = pvVar5;
          DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDStack_50);
          DVar6 = Accessor;
          if (propertyRecord != (PropertyRecord *)0x0) {
            (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = (_func_int **)instance;
            propertyRecord->pid = 0xffff;
          }
        }
      }
      else {
        DVar6 = WritableData;
        if ((pDStack_50->Attributes & 4) == 0) {
          DVar6 = (uint)(pDStack_50->Attributes >> 7) * 8 + Data;
        }
      }
    }
  }
  else {
    bVar2 = DynamicObject::HasObjectArray(instance);
    DVar6 = None;
    if ((bVar2) && (descriptor[1].flags == PreventFalseReference)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
      DVar6 = GetItemSetter(this,instance,index,setterValue,requestContext);
    }
  }
  return DVar6;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter_Internal(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DictionaryPropertyDescriptor<T>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetSetterFromDescriptor<allowLetConstGlobal>(instance, descriptor, setterValue, info);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::GetItemSetter(instance, propertyRecord->GetNumericValue(), setterValue, requestContext);
        }

        return None;
    }